

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O2

void __thiscall FileWriter::logTime(FileWriter *this,Timer *t)

{
  long lVar1;
  ostream *poVar2;
  duration<double,_std::ratio<1L,_1L>_> dVar3;
  
  lVar1 = std::cout;
  if (t != (Timer *)0x0) {
    *(uint *)(strstr + *(long *)(std::cout + -0x18)) =
         *(uint *)(strstr + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(__ctype_tolower_loc + *(long *)(lVar1 + -0x18)) = 3;
    std::operator<<((ostream *)&std::cout," (took ");
    dVar3 = Timer::elapsed(t);
    poVar2 = std::ostream::_M_insert<double>(dVar3.__r);
    poVar2 = std::operator<<(poVar2,"s)");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void FileWriter::logTime(const Timer* t) {
  if (t) {
    std::cout
      << std::fixed
      << std::setprecision(3)
      << " (took "
      << t->elapsed().count()
      << "s)"
      << std::endl;
  } else {
    std::cout << std::endl;
  }
}